

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.hpp
# Opt level: O0

bool __thiscall tcmalloc::PageHeap::CheckSmallList(PageHeap *this)

{
  Span *pSVar1;
  Span *local_38;
  Span *span_1;
  Span *span;
  int count;
  int i;
  uint64_t small_returned_bytes;
  uint64_t small_normal_bytes;
  PageHeap *this_local;
  
  small_returned_bytes = 0;
  _count = 0;
  span._4_4_ = 0;
  do {
    if (0x7f < span._4_4_) {
      if (small_returned_bytes != (this->stat).small_normal_bytes) {
        __assert_fail("small_normal_bytes == stat.small_normal_bytes",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                      ,0x1be,"bool tcmalloc::PageHeap::CheckSmallList()");
      }
      if (_count == (this->stat).small_returned_bytes) {
        return true;
      }
      __assert_fail("small_returned_bytes == stat.small_returned_bytes",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                    ,0x1bf,"bool tcmalloc::PageHeap::CheckSmallList()");
    }
    span._0_4_ = (int)this->small_normal_size_[(int)span._4_4_];
    for (span_1 = this->small_normal_[(int)span._4_4_].next;
        span_1 != this->small_normal_ + (int)span._4_4_; span_1 = span_1->next) {
      span._0_4_ = (int)span + -1;
      if ((int)span < 0) {
        __assert_fail("count >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                      ,0x1ab,"bool tcmalloc::PageHeap::CheckSmallList()");
      }
      if (span_1->location != 1) {
        __assert_fail("span->location == Span::IN_NORMAL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                      ,0x1ac,"bool tcmalloc::PageHeap::CheckSmallList()");
      }
      pSVar1 = (Span *)PageMap::Get(&this->page_map_,span_1->page_id);
      if (pSVar1 != span_1) {
        __assert_fail("page_map_.Get(span->page_id) == span",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                      ,0x1ad,"bool tcmalloc::PageHeap::CheckSmallList()");
      }
      pSVar1 = (Span *)PageMap::Get(&this->page_map_,(span_1->page_id + span_1->npages) - 1);
      if (pSVar1 != span_1) {
        __assert_fail("page_map_.Get(span->page_id + span->npages - 1) == span",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                      ,0x1ae,"bool tcmalloc::PageHeap::CheckSmallList()");
      }
      small_returned_bytes = span_1->npages * 0x2000 + small_returned_bytes;
    }
    if ((int)span != 0) {
      __assert_fail("count == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                    ,0x1b1,"bool tcmalloc::PageHeap::CheckSmallList()");
    }
    span._0_4_ = (int)this->small_returned_size_[(int)span._4_4_];
    for (local_38 = this->small_returned_[(int)span._4_4_].next;
        local_38 != this->small_returned_ + (int)span._4_4_; local_38 = local_38->next) {
      span._0_4_ = (int)span + -1;
      if ((int)span < 0) {
        __assert_fail("count >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                      ,0x1b5,"bool tcmalloc::PageHeap::CheckSmallList()");
      }
      if (local_38->location != 2) {
        __assert_fail("span->location == Span::IN_RETURNED",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                      ,0x1b6,"bool tcmalloc::PageHeap::CheckSmallList()");
      }
      pSVar1 = (Span *)PageMap::Get(&this->page_map_,local_38->page_id);
      if (pSVar1 != local_38) {
        __assert_fail("page_map_.Get(span->page_id) == span",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                      ,0x1b7,"bool tcmalloc::PageHeap::CheckSmallList()");
      }
      pSVar1 = (Span *)PageMap::Get(&this->page_map_,(local_38->page_id + local_38->npages) - 1);
      if (pSVar1 != local_38) {
        __assert_fail("page_map_.Get(span->page_id + span->npages - 1) == span",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                      ,0x1b8,"bool tcmalloc::PageHeap::CheckSmallList()");
      }
      _count = local_38->npages * 0x2000 + _count;
    }
    if ((int)span != 0) {
      __assert_fail("count == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                    ,0x1bb,"bool tcmalloc::PageHeap::CheckSmallList()");
    }
    span._4_4_ = span._4_4_ + 1;
  } while( true );
}

Assistant:

bool CheckSmallList() {
        uint64_t small_normal_bytes = 0;
        uint64_t small_returned_bytes = 0;

        for (int i = 0; i <= spanSmallPages; ++i) {
            int count = small_normal_size_[i];
            for (Span* span = small_normal_[i].next; span != &small_normal_[i]; span = span->next) {
                count--;
                assert(count >= 0);
                assert(span->location == Span::IN_NORMAL);
                assert(page_map_.Get(span->page_id) == span);
                assert(page_map_.Get(span->page_id + span->npages - 1) == span);
                small_normal_bytes += span->npages * spanPageSize;
            }
            assert(count == 0);
            count = small_returned_size_[i];
            for (Span* span = small_returned_[i].next; span != &small_returned_[i]; span = span->next) {
                count--;
                assert(count >= 0);
                assert(span->location == Span::IN_RETURNED);
                assert(page_map_.Get(span->page_id) == span);
                assert(page_map_.Get(span->page_id + span->npages - 1) == span);
                small_returned_bytes += span->npages * spanPageSize;
            }
            assert(count == 0);
        }

        assert(small_normal_bytes == stat.small_normal_bytes);
        assert(small_returned_bytes == stat.small_returned_bytes);
        return true;
    }